

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O2

SpatialSplit * __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
sequential_spatial_find
          (SpatialSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize)

{
  Vec3fa *pVVar1;
  PrimRef *pPVar2;
  int *piVar3;
  undefined1 (*pauVar4) [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  PrimRef *pPVar7;
  TriangleSplitterFactory *pTVar8;
  ulong uVar9;
  Geometry *pGVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  long lVar19;
  RTCFilterFunctionN p_Var20;
  long lVar21;
  float *pfVar22;
  ulong uVar23;
  ulong uVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar25;
  size_t i;
  long lVar26;
  unsigned_long uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 *puVar31;
  size_t dim;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar43;
  float fVar44;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar45;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar67;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  SpatialBinMapping<16UL> mapping;
  TriangleSplitter splitter;
  vint4 bin1;
  vint4 bin0;
  SpatialBinner binner;
  ulong local_9b0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_960;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_950;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_940;
  undefined1 local_930 [16];
  float local_920 [4];
  undefined1 local_910 [16];
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  undefined1 local_8d0 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_8c0;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_8b0;
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_880;
  float afStack_870 [380];
  long local_280 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_180 [21];
  
  paVar25 = local_180;
  for (lVar26 = 0x50; lVar26 != 0x650; lVar26 = lVar26 + 0x60) {
    *(undefined1 (*) [16])(local_890 + lVar26) = _DAT_01f45a30;
    *(undefined8 *)((long)&local_880.field_1.x + lVar26) = 0xff800000ff800000;
    *(undefined8 *)((long)&local_880 + lVar26 + 8U) = 0xff800000ff800000;
    *(undefined1 (*) [16])((long)&local_8b0 + lVar26) = _DAT_01f45a30;
    *(undefined8 *)(local_8a0 + lVar26) = 0xff800000ff800000;
    *(undefined8 *)(local_8a0 + lVar26 + 8) = 0xff800000ff800000;
    *(undefined1 (*) [16])(local_8d0 + lVar26) = _DAT_01f45a30;
    *(undefined8 *)((long)&local_8c0 + lVar26) = 0xff800000ff800000;
    *(undefined8 *)((long)&local_8c0 + lVar26 + 8) = 0xff800000ff800000;
    *(undefined8 *)paVar25 = 0;
    *(undefined8 *)((long)paVar25->m128 + 8) = 0;
    *(undefined8 *)((long)paVar25 + 0xffffffffffffff00) = 0;
    *(undefined8 *)((long)paVar25 + 0xffffffffffffff08) = 0;
    paVar25 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)((long)paVar25 + 0x10);
  }
  local_960.v[0] = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[0];
  local_960.v[1] = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[1];
  local_960.v[2] = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[2];
  local_960.v[3] = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[3];
  pVVar1 = &(set->super_CentGeomBBox3fa).geomBounds.upper;
  fVar48 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[2];
  fVar49 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[3];
  auVar36._0_8_ =
       *(ulong *)&(set->super_CentGeomBBox3fa).geomBounds.lower.field_0 & 0x7fffffff7fffffff;
  auVar36._8_4_ = ABS(local_960.v[2]);
  auVar36._12_4_ = ABS(local_960.v[3]);
  auVar69._0_8_ = *(ulong *)&pVVar1->field_0 & 0x7fffffff7fffffff;
  auVar69._8_4_ = ABS(fVar48);
  auVar69._12_4_ = ABS(fVar49);
  auVar37 = maxps(auVar36,auVar69);
  fVar35 = auVar37._0_4_ * 1.5258789e-05;
  fVar43 = auVar37._4_4_ * 1.5258789e-05;
  auVar70._4_4_ = fVar43;
  auVar70._0_4_ = fVar35;
  fVar44 = auVar37._8_4_ * 1.5258789e-05;
  fVar45 = auVar37._12_4_ * 1.5258789e-05;
  fVar46 = (pVVar1->field_0).m128[0] - local_960.v[0];
  fVar47 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[1] - local_960.v[1];
  fVar48 = fVar48 - local_960.v[2];
  fVar49 = fVar49 - local_960.v[3];
  auVar70._8_4_ = fVar44;
  auVar70._12_4_ = fVar45;
  auVar37._4_4_ = fVar47;
  auVar37._0_4_ = fVar46;
  auVar37._8_4_ = fVar48;
  auVar37._12_4_ = fVar49;
  auVar37 = maxps(auVar70,auVar37);
  auVar37 = divps(_DAT_01f46b90,auVar37);
  local_950.i[0] = -(uint)(fVar35 < fVar46) & auVar37._0_4_;
  local_950.i[1] = -(uint)(fVar43 < fVar47) & auVar37._4_4_;
  local_950.i[2] = -(uint)(fVar44 < fVar48) & auVar37._8_4_;
  local_950.i[3] = -(uint)(fVar45 < fVar49) & auVar37._12_4_;
  uVar63 = (undefined4)DAT_01f46a60;
  uVar64 = DAT_01f46a60._4_4_;
  uVar65 = DAT_01f46a60._8_4_;
  uVar66 = DAT_01f46a60._12_4_;
  auVar32._4_4_ = local_950.i[1];
  auVar32._0_4_ = local_950.i[0];
  auVar32._8_4_ = local_950.i[2];
  auVar32._12_4_ = local_950.i[3];
  local_940 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)divps(_DAT_01f46a60,auVar32);
  pPVar7 = this->prims0;
  pTVar8 = this->splitterFactory;
  uVar27 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar9 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  do {
    if (uVar9 <= uVar27) {
      SpatialBinInfo<16UL,_embree::PrimRef>::best
                (__return_storage_ptr__,(SpatialBinInfo<16UL,_embree::PrimRef> *)&local_880.field_1,
                 (SpatialBinMapping<16UL> *)&local_960,logBlockSize);
      return __return_storage_ptr__;
    }
    pPVar2 = pPVar7 + uVar27;
    if ((uint)pPVar7[uVar27].lower.field_0.m128[3] < 0x10000000) {
      aVar5 = (pPVar2->lower).field_0.field_1;
      aVar6 = (pPVar2->upper).field_0.field_1;
      auVar61._0_4_ = (int)(((aVar5.x + aVar6.x) * 0.5 - local_960.v[0]) * local_950.v[0] + -0.5);
      auVar61._4_4_ = (int)(((aVar5.y + aVar6.y) * 0.5 - local_960.v[1]) * local_950.v[1] + -0.5);
      auVar61._8_4_ = (int)(((aVar5.z + aVar6.z) * 0.5 - local_960.v[2]) * local_950.v[2] + -0.5);
      auVar61._12_4_ =
           (int)(((aVar5.field_3.w + aVar6.field_3.w) * 0.5 - local_960.v[3]) * local_950.v[3] +
                -0.5);
      auVar58._0_4_ = -(uint)(0xe < auVar61._0_4_);
      auVar58._4_4_ = -(uint)(0xe < auVar61._4_4_);
      auVar58._8_4_ = -(uint)(0xe < auVar61._8_4_);
      auVar58._12_4_ = -(uint)(0xe < auVar61._12_4_);
      auVar61 = ~auVar58 & auVar61;
      auVar62._0_4_ = auVar61._0_4_ >> 0x1f;
      auVar62._4_4_ = auVar61._4_4_ >> 0x1f;
      auVar62._8_4_ = auVar61._8_4_ >> 0x1f;
      auVar62._12_4_ = auVar61._12_4_ >> 0x1f;
      local_930 = ~auVar62 & (auVar58 & _DAT_01f46bb0 | auVar61);
      for (lVar26 = 0; lVar26 != 0xc; lVar26 = lVar26 + 4) {
        lVar19 = (long)*(int *)(local_930 + lVar26);
        piVar3 = (int *)((long)local_280 + lVar26 + lVar19 * 0x10);
        *piVar3 = *piVar3 + 1;
        piVar3 = (int *)((long)local_180 + lVar26 + lVar19 * 0x10);
        *piVar3 = *piVar3 + 1;
        auVar37 = *(undefined1 (*) [16])((long)afStack_870 + lVar26 * 8 + lVar19 * 0x60);
        auVar32 = minps(*(undefined1 (*) [16])((long)&local_880 + lVar26 * 8 + lVar19 * 0x60),
                        (undefined1  [16])aVar5);
        *(undefined1 (*) [16])((long)&local_880 + lVar26 * 8 + lVar19 * 0x60) = auVar32;
        auVar37 = maxps(auVar37,(undefined1  [16])aVar6);
        *(undefined1 (*) [16])((long)afStack_870 + lVar26 * 8 + lVar19 * 0x60) = auVar37;
      }
    }
    else {
      aVar5 = (pPVar2->lower).field_0.field_1;
      auVar53._0_4_ = (int)((aVar5.x - local_960.v[0]) * local_950.v[0] + -0.5);
      auVar53._4_4_ = (int)((aVar5.y - local_960.v[1]) * local_950.v[1] + -0.5);
      auVar53._8_4_ = (int)((aVar5.z - local_960.v[2]) * local_950.v[2] + -0.5);
      auVar53._12_4_ = (int)((aVar5.field_3.w - local_960.v[3]) * local_950.v[3] + -0.5);
      auVar38._0_4_ = -(uint)(0xe < auVar53._0_4_);
      auVar38._4_4_ = -(uint)(0xe < auVar53._4_4_);
      auVar38._8_4_ = -(uint)(0xe < auVar53._8_4_);
      auVar38._12_4_ = -(uint)(0xe < auVar53._12_4_);
      auVar53 = ~auVar38 & auVar53;
      auVar54._0_4_ = auVar53._0_4_ >> 0x1f;
      auVar54._4_4_ = auVar53._4_4_ >> 0x1f;
      auVar54._8_4_ = auVar53._8_4_ >> 0x1f;
      auVar54._12_4_ = auVar53._12_4_ >> 0x1f;
      fVar48 = (pPVar2->lower).field_0.m128[3];
      local_890 = ~auVar54 & (auVar38 & _DAT_01f46bb0 | auVar53);
      aVar6 = (pPVar2->upper).field_0.field_1;
      auVar55._0_4_ = (int)((aVar6.x - local_960.v[0]) * local_950.v[0] + -0.5);
      auVar55._4_4_ = (int)((aVar6.y - local_960.v[1]) * local_950.v[1] + -0.5);
      auVar55._8_4_ = (int)((aVar6.z - local_960.v[2]) * local_950.v[2] + -0.5);
      auVar55._12_4_ = (int)((aVar6.field_3.w - local_960.v[3]) * local_950.v[3] + -0.5);
      auVar39._0_4_ = -(uint)(0xe < auVar55._0_4_);
      auVar39._4_4_ = -(uint)(0xe < auVar55._4_4_);
      auVar39._8_4_ = -(uint)(0xe < auVar55._8_4_);
      auVar39._12_4_ = -(uint)(0xe < auVar55._12_4_);
      auVar55 = ~auVar39 & auVar55;
      auVar56._0_4_ = auVar55._0_4_ >> 0x1f;
      auVar56._4_4_ = auVar55._4_4_ >> 0x1f;
      auVar56._8_4_ = auVar55._8_4_ >> 0x1f;
      auVar56._12_4_ = auVar55._12_4_ >> 0x1f;
      fVar49 = (pPVar2->upper).field_0.m128[3];
      local_8a0 = ~auVar56 & (auVar39 & _DAT_01f46bb0 | auVar55);
      puVar31 = local_930;
      for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
        fVar35 = *(float *)((long)&local_950 + lVar26 * 4);
        if ((fVar35 != 0.0) || (NAN(fVar35))) {
          uVar24 = (ulong)*(int *)(local_890 + lVar26 * 4);
          uVar23 = (ulong)*(int *)(local_8a0 + lVar26 * 4);
          if (*(int *)(local_890 + lVar26 * 4) == *(int *)(local_8a0 + lVar26 * 4)) {
            piVar3 = (int *)((long)local_280 + lVar26 * 4 + uVar24 * 0x10);
            *piVar3 = *piVar3 + 1;
            piVar3 = (int *)((long)(local_180 + uVar24) + lVar26 * 4);
            *piVar3 = *piVar3 + 1;
            auVar37 = *(undefined1 (*) [16])((long)afStack_870 + lVar26 * 0x20 + uVar24 * 0x60);
            auVar32 = minps(*(undefined1 (*) [16])(&local_880 + uVar24 * 6 + lVar26 * 2U),
                            (undefined1  [16])aVar5);
            (&local_880)[uVar24 * 6 + lVar26 * 2U] = (anon_union_16_2_47237d3f_for_Vec3fa_0)auVar32;
            auVar37 = maxps(auVar37,(undefined1  [16])aVar6);
            *(undefined1 (*) [16])((long)afStack_870 + lVar26 * 0x20 + uVar24 * 0x60) = auVar37;
          }
          else {
            local_8c0.m128[0] = aVar5.x;
            local_8c0.m128[1] = aVar5.y;
            local_8c0.m128[2] = aVar5.z;
            local_8c0.m128[3] = (float)aVar5.field_3;
            local_8b0.m128[0] = aVar6.x;
            local_8b0.m128[1] = aVar6.y;
            local_8b0.m128[2] = aVar6.z;
            local_8b0.m128[3] = (float)aVar6.field_3;
            uVar18 = uVar24;
            uVar29 = uVar23;
            if (uVar23 < uVar24) {
              uVar29 = uVar24;
            }
            do {
              uVar28 = uVar18;
              uVar30 = uVar29;
              if (uVar23 <= uVar28) break;
              uVar18 = uVar28 + 1;
              uVar30 = uVar28;
            } while ((float)(uVar28 + 1) * *(float *)((long)&local_940 + lVar26 * 4) +
                     *(float *)((long)&local_960 + lVar26 * 4) <=
                     *(float *)((long)&local_8c0 + lVar26 * 4));
            uVar18 = uVar23;
            uVar29 = uVar23;
            if (uVar30 < uVar23) {
              uVar29 = uVar30;
            }
            while ((local_9b0 = uVar29, uVar30 < uVar18 &&
                   (local_9b0 = uVar18,
                   *(float *)((long)&local_8b0 + lVar26 * 4) <=
                   (float)uVar18 * *(float *)((long)&local_940 + lVar26 * 4) +
                   *(float *)((long)&local_960 + lVar26 * 4)))) {
              uVar18 = uVar18 - 1;
            }
            pGVar10 = (pTVar8->scene->geometries).items[(uint)fVar48 & 0x7ffffff].ptr;
            lVar21 = pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                     (ulong)(uint)fVar49;
            lVar19 = *(long *)&pGVar10->field_0x58;
            lVar11 = *(long *)&pGVar10[1].time_range.upper;
            p_Var20 = pGVar10[1].intersectionFilterN;
            pauVar4 = (undefined1 (*) [16])
                      (lVar11 + (ulong)*(uint *)(lVar19 + lVar21) * (long)p_Var20);
            local_900 = *(float *)*pauVar4;
            fStack_8fc = *(float *)(*pauVar4 + 4);
            fStack_8f8 = *(float *)(*pauVar4 + 8);
            fStack_8f4 = *(float *)(*pauVar4 + 0xc);
            local_930 = *pauVar4;
            pfVar22 = (float *)(lVar11 + (ulong)*(uint *)(lVar19 + 4 + lVar21) * (long)p_Var20);
            local_920[0] = *pfVar22;
            local_920[1] = pfVar22[1];
            local_920[2] = pfVar22[2];
            local_920[3] = pfVar22[3];
            local_910 = *(undefined1 (*) [16])
                         (lVar11 + (ulong)*(uint *)(lVar19 + 8 + lVar21) * (long)p_Var20);
            auVar57._0_4_ = local_910._0_4_ - local_920[0];
            auVar57._4_4_ = local_910._4_4_ - local_920[1];
            auVar57._8_4_ = local_910._8_4_ - local_920[2];
            auVar57._12_4_ = local_910._12_4_ - local_920[3];
            auVar40._0_4_ = local_920[0] - local_900;
            auVar40._4_4_ = local_920[1] - fStack_8fc;
            auVar40._8_4_ = local_920[2] - fStack_8f8;
            auVar40._12_4_ = local_920[3] - fStack_8f4;
            auVar60._4_4_ = uVar64;
            auVar60._0_4_ = uVar63;
            auVar60._8_4_ = uVar65;
            auVar60._12_4_ = uVar66;
            local_8f0 = divps(auVar60,auVar40);
            auVar41._4_4_ = uVar64;
            auVar41._0_4_ = uVar63;
            auVar41._8_4_ = uVar65;
            auVar41._12_4_ = uVar66;
            local_8e0 = divps(auVar41,auVar57);
            auVar33._0_4_ = local_900 - local_910._0_4_;
            auVar33._4_4_ = fStack_8fc - local_910._4_4_;
            auVar33._8_4_ = fStack_8f8 - local_910._8_4_;
            auVar33._12_4_ = fStack_8f4 - local_910._12_4_;
            auVar42._4_4_ = uVar64;
            auVar42._0_4_ = uVar63;
            auVar42._8_4_ = uVar65;
            auVar42._12_4_ = uVar66;
            local_8d0 = divps(auVar42,auVar33);
            fVar35 = aVar6.x;
            fVar43 = aVar6.y;
            fVar44 = aVar6.z;
            aVar67.a = aVar6.field_3.a;
            fVar45 = aVar5.x;
            fVar46 = aVar5.y;
            fVar47 = aVar5.z;
            aVar68.a = aVar5.field_3.a;
            while (uVar30 < local_9b0) {
              fVar52 = (float)(uVar30 + 1) * *(float *)((long)&local_940 + lVar26 * 4) +
                       *(float *)((long)&local_960 + lVar26 * 4);
              auVar37 = _DAT_01f45a30;
              auVar32 = _DAT_01f45a40;
              auVar69 = _DAT_01f45a30;
              auVar70 = _DAT_01f45a40;
              for (lVar19 = 0; lVar19 != 0x30; lVar19 = lVar19 + 0x10) {
                fVar59 = *(float *)(puVar31 + lVar19);
                if (fVar59 <= fVar52) {
                  auVar37 = minps(auVar37,*(undefined1 (*) [16])(local_930 + lVar19));
                  auVar32 = maxps(auVar32,*(undefined1 (*) [16])(local_930 + lVar19));
                }
                if (fVar52 <= fVar59) {
                  auVar69 = minps(auVar69,*(undefined1 (*) [16])(local_930 + lVar19));
                  auVar70 = maxps(auVar70,*(undefined1 (*) [16])(local_930 + lVar19));
                }
                if (((fVar59 < fVar52) && (fVar52 < *(float *)(puVar31 + lVar19 + 0x10))) ||
                   ((fVar52 < fVar59 && (*(float *)(puVar31 + lVar19 + 0x10) < fVar52)))) {
                  fVar59 = (fVar52 - fVar59) * *(float *)(puVar31 + lVar19 + 0x40);
                  auVar36 = *(undefined1 (*) [16])(local_930 + lVar19);
                  auVar50._0_4_ =
                       (*(float *)((long)local_920 + lVar19) - auVar36._0_4_) * fVar59 +
                       auVar36._0_4_;
                  auVar50._4_4_ =
                       (*(float *)((long)local_920 + lVar19 + 4) - auVar36._4_4_) * fVar59 +
                       auVar36._4_4_;
                  auVar50._8_4_ =
                       (*(float *)((long)local_920 + lVar19 + 8) - auVar36._8_4_) * fVar59 +
                       auVar36._8_4_;
                  auVar50._12_4_ =
                       (*(float *)(local_910 + lVar19 + -4) - auVar36._12_4_) * fVar59 +
                       auVar36._12_4_;
                  auVar37 = minps(auVar37,auVar50);
                  auVar32 = maxps(auVar32,auVar50);
                  auVar69 = minps(auVar69,auVar50);
                  auVar70 = maxps(auVar70,auVar50);
                }
              }
              auVar15._4_4_ = fVar46;
              auVar15._0_4_ = fVar45;
              auVar15._8_4_ = fVar47;
              auVar15._12_4_ = aVar68.a;
              auVar37 = maxps(auVar37,auVar15);
              auVar12._4_4_ = fVar43;
              auVar12._0_4_ = fVar35;
              auVar12._8_4_ = fVar44;
              auVar12._12_4_ = aVar67.a;
              auVar32 = minps(auVar32,auVar12);
              auVar51._4_4_ = -(uint)(auVar37._4_4_ <= auVar32._4_4_);
              auVar51._0_4_ = -(uint)(auVar37._0_4_ <= auVar32._0_4_);
              auVar51._8_4_ = -(uint)(auVar37._8_4_ <= auVar32._8_4_);
              auVar51._12_4_ = -(uint)(auVar37._12_4_ <= auVar32._12_4_);
              uVar63 = movmskps(0x30,auVar51);
              if ((~(byte)uVar63 & 7) != 0) {
                uVar24 = uVar24 + 1;
              }
              auVar16._4_4_ = fVar46;
              auVar16._0_4_ = fVar45;
              auVar16._8_4_ = fVar47;
              auVar16._12_4_ = aVar68.a;
              auVar69 = maxps(auVar69,auVar16);
              auVar13._4_4_ = fVar43;
              auVar13._0_4_ = fVar35;
              auVar13._8_4_ = fVar44;
              auVar13._12_4_ = aVar67.a;
              auVar70 = minps(auVar70,auVar13);
              p_Var20 = (RTCFilterFunctionN)(lVar26 * 0x20);
              pfVar22 = (float *)(&local_880 + uVar30 * 6);
              auVar37 = minps(*(undefined1 (*) [16])(p_Var20 + (long)pfVar22),auVar37);
              *(undefined1 (*) [16])(p_Var20 + (long)pfVar22) = auVar37;
              auVar37 = maxps(*(undefined1 (*) [16])(p_Var20 + 0x10 + (long)pfVar22),auVar32);
              *(undefined1 (*) [16])(p_Var20 + 0x10 + (long)pfVar22) = auVar37;
              fVar35 = auVar70._0_4_;
              fVar43 = auVar70._4_4_;
              fVar44 = auVar70._8_4_;
              aVar67.a = auVar70._12_4_;
              fVar45 = auVar69._0_4_;
              fVar46 = auVar69._4_4_;
              fVar47 = auVar69._8_4_;
              aVar68.a = auVar69._12_4_;
              uVar30 = uVar30 + 1;
            }
            auVar34._4_4_ = -(uint)(fVar46 <= fVar43);
            auVar34._0_4_ = -(uint)(fVar45 <= fVar35);
            auVar34._8_4_ = -(uint)(fVar47 <= fVar44);
            auVar34._12_4_ = -(uint)(aVar68.w <= aVar67.w);
            uVar63 = movmskps((int)p_Var20,auVar34);
            if ((~(byte)uVar63 & 7) != 0) {
              uVar23 = uVar23 - 1;
            }
            piVar3 = (int *)((long)local_280 + lVar26 * 4 + uVar24 * 0x10);
            *piVar3 = *piVar3 + 1;
            piVar3 = (int *)((long)(local_180 + uVar23) + lVar26 * 4);
            *piVar3 = *piVar3 + 1;
            auVar37 = *(undefined1 (*) [16])((long)afStack_870 + lVar26 * 0x20 + uVar30 * 0x60);
            auVar17._4_4_ = fVar46;
            auVar17._0_4_ = fVar45;
            auVar17._8_4_ = fVar47;
            auVar17._12_4_ = aVar68.a;
            auVar32 = minps(*(undefined1 (*) [16])(&local_880 + uVar30 * 6 + lVar26 * 2U),auVar17);
            (&local_880)[uVar30 * 6 + lVar26 * 2U] = (anon_union_16_2_47237d3f_for_Vec3fa_0)auVar32;
            auVar14._4_4_ = fVar43;
            auVar14._0_4_ = fVar35;
            auVar14._8_4_ = fVar44;
            auVar14._12_4_ = aVar67.a;
            auVar37 = maxps(auVar37,auVar14);
            *(undefined1 (*) [16])((long)afStack_870 + lVar26 * 0x20 + uVar30 * 0x60) = auVar37;
            uVar63 = 0x3f800000;
            uVar64 = 0x3f800000;
            uVar65 = 0x3f800000;
            uVar66 = 0x3f800000;
          }
        }
        puVar31 = puVar31 + 4;
      }
    }
    uVar27 = uVar27 + 1;
  } while( true );
}

Assistant:

sequential_spatial_find(const PrimInfoExtRange& set, const size_t logBlockSize)
        {
          SpatialBinner binner(empty); 
          const SpatialBinMapping<SPATIAL_BINS> mapping(set);
          binner.bin2(splitterFactory,prims0,set.begin(),set.end(),mapping);
          /* todo: best spatial split not exceeding the extended range does not provide any benefit ?*/
          return binner.best(mapping,logBlockSize); //,set.ext_size());
        }